

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O1

int gz_decomp(gz_statep state)

{
  uInt uVar1;
  uInt uVar2;
  unsigned_long crc_00;
  char *pcVar3;
  int iVar4;
  uLong uVar5;
  char *msg;
  int iVar6;
  uchar *buf;
  uint len_00;
  unsigned_long len;
  unsigned_long crc;
  ulong local_40;
  uLong local_38;
  
  uVar1 = (state->strm).avail_out;
  do {
    if (((state->strm).avail_in == 0) && (iVar4 = gz_avail(state), iVar4 == -1)) goto LAB_004adebb;
    if ((state->strm).avail_in == 0) goto LAB_004ade7f;
    iVar4 = inflate(&state->strm,0);
    switch(iVar4) {
    case -4:
      msg = "out of memory";
      iVar4 = -4;
      goto LAB_004adeb6;
    case -3:
      pcVar3 = (state->strm).msg;
      msg = "compressed data error";
      if (pcVar3 != (char *)0x0) {
        msg = pcVar3;
      }
      goto LAB_004adeae;
    case -2:
    case 2:
      msg = "internal error: inflate stream corrupt";
      iVar4 = -2;
      goto LAB_004adeb6;
    }
    uVar2 = (state->strm).avail_out;
  } while ((iVar4 != 1) && (uVar2 != 0));
  len_00 = uVar1 - uVar2;
  state->have = len_00;
  buf = (state->strm).next_out + -(ulong)len_00;
  crc_00 = (state->strm).adler;
  state->next = buf;
  uVar5 = crc32(crc_00,buf,len_00);
  (state->strm).adler = uVar5;
  iVar6 = 0;
  if (iVar4 == 1) {
    iVar4 = gz_next4(state,&local_38);
    if ((iVar4 == -1) || (iVar4 = gz_next4(state,&local_40), iVar4 == -1)) {
LAB_004ade7f:
      msg = "unexpected end of file";
    }
    else if (local_38 == (state->strm).adler) {
      if (local_40 == (uint)(state->strm).total_out) {
        state->how = 0;
        return 0;
      }
      msg = "incorrect length check";
    }
    else {
      msg = "incorrect data check";
    }
LAB_004adeae:
    iVar4 = -3;
LAB_004adeb6:
    gz_error(state,iVar4,msg);
LAB_004adebb:
    iVar6 = -1;
  }
  return iVar6;
}

Assistant:

local int gz_decomp(gz_statep state)
{
    int ret;
    unsigned had;
    unsigned long crc, len;
    z_streamp strm = &(state->strm);

    /* fill output buffer up to end of deflate stream */
    had = strm->avail_out;
    do {
        /* get more input for inflate() */
        if (strm->avail_in == 0 && gz_avail(state) == -1)
            return -1;
        if (strm->avail_in == 0) {
            gz_error(state, Z_DATA_ERROR, "unexpected end of file");
            return -1;
        }

        /* decompress and handle errors */
        ret = inflate(strm, Z_NO_FLUSH);
        if (ret == Z_STREAM_ERROR || ret == Z_NEED_DICT) {
            gz_error(state, Z_STREAM_ERROR,
                      "internal error: inflate stream corrupt");
            return -1;
        }
        if (ret == Z_MEM_ERROR) {
            gz_error(state, Z_MEM_ERROR, "out of memory");
            return -1;
        }
        if (ret == Z_DATA_ERROR) {              /* deflate stream invalid */
            gz_error(state, Z_DATA_ERROR,
                      strm->msg == NULL ? "compressed data error" : strm->msg);
            return -1;
        }
    } while (strm->avail_out && ret != Z_STREAM_END);

    /* update available output and crc check value */
    state->have = had - strm->avail_out;
    state->next = strm->next_out - state->have;
    strm->adler = crc32(strm->adler, state->next, state->have);

    /* check gzip trailer if at end of deflate stream */
    if (ret == Z_STREAM_END) {
        if (gz_next4(state, &crc) == -1 || gz_next4(state, &len) == -1) {
            gz_error(state, Z_DATA_ERROR, "unexpected end of file");
            return -1;
        }
        if (crc != strm->adler) {
            gz_error(state, Z_DATA_ERROR, "incorrect data check");
            return -1;
        }
        if (len != (strm->total_out & 0xffffffffL)) {
            gz_error(state, Z_DATA_ERROR, "incorrect length check");
            return -1;
        }
        state->how = LOOK;      /* ready for next stream, once have is 0 (leave
                                   state->direct unchanged to remember how) */
    }

    /* good decompression */
    return 0;
}